

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderTexture2D::invokeGLES2
          (RenderTexture2D *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  pointer *this_00;
  TestLog *log;
  Functions *gl;
  glReadPixelsFunc p_Var1;
  bool bVar2;
  GLenum GVar3;
  GLuint GVar4;
  GLint GVar5;
  MessageBuilder *this_01;
  TestError *pTVar6;
  code *pcVar7;
  pointer_____offset_0x10___ *ppuVar8;
  Surface screen;
  Surface refSurface;
  Texture srcTex;
  PixelBufferAccess local_1d8;
  Program program;
  
  log = (api->super_CallLogWrapper).m_log;
  gl = api->m_gl;
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&srcTex,gl);
  if ((reference->super_TextureLevelPyramid).m_format.order - D < 3) {
    pTVar6 = (TestError *)__cxa_allocate_exception(8);
    *(undefined ***)&(pTVar6->super_TestException).super_Exception = &PTR__exception_003de498;
    pcVar7 = std::exception::~exception;
    ppuVar8 = &IllegalRendererException::typeinfo;
  }
  else {
    (*gl->clearColor)(0.0,0.0,0.0,0.0);
    (*gl->viewport)(0,0,reference->m_width,reference->m_height);
    (*gl->clear)(0x4100);
    (*gl->disable)(0xb71);
    this_00 = &program.super_ShaderProgram.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    program.super_ShaderProgram.m_shaders[0].
    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Rendering EGLImage as GL_TEXTURE_2D in context: ");
    this_01 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&program,&(api->super_ImageApi).m_contextId);
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    if (((img->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).m_data.
        ptr)->m_image != (EGLImage)0x0) {
      (*gl->bindTexture)(0xde1,srcTex.super_ObjectWrapper.m_object);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"bindTexture(GL_TEXTURE_2D, *srcTex)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x18c);
      imageTargetTexture2D
                ((api->super_ImageApi).m_egl,gl,
                 ((img->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>)
                  .m_data.ptr)->m_image);
      (*gl->texParameteri)(0xde1,0x2801,0x2600);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,399);
      (*gl->texParameteri)(0xde1,0x2800,0x2600);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,400);
      (*gl->texParameteri)(0xde1,0x2803,0x812f);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x191);
      (*gl->texParameteri)(0xde1,0x2802,0x812f);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x192);
      anon_unknown_1::Program::Program
                (&program,gl,
                 "attribute highp vec2 a_coord;\nvarying mediump vec2 v_texCoord;\nvoid main(void) {\n\tv_texCoord = vec2((a_coord.x + 1.0) * 0.5, (a_coord.y + 1.0) * 0.5);\n\tgl_Position = vec4(a_coord, -0.1, 1.0);\n}\n"
                 ,
                 "varying mediump vec2 v_texCoord;\nuniform sampler2D u_sampler;\nvoid main(void) {\n\tmediump vec4 texColor = texture2D(u_sampler, v_texCoord);\n\tgl_FragColor = vec4(texColor);\n}"
                );
      if (program.super_ShaderProgram.m_program.m_info.linkOk == false) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"program.isOk()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                   ,0x1a5);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*gl->useProgram)(program.super_ShaderProgram.m_program.m_program);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"useProgram(glProgram)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                      ,0x1a8);
      GVar4 = (*gl->getAttribLocation)(program.super_ShaderProgram.m_program.m_program,"a_coord");
      if (GVar4 != 0xffffffff) {
        GVar5 = (*gl->getUniformLocation)
                          (program.super_ShaderProgram.m_program.m_program,"u_sampler");
        if (GVar5 != -1) {
          (*gl->bindTexture)(0xde1,srcTex.super_ObjectWrapper.m_object);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"bindTexture(GL_TEXTURE_2D, *srcTex)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                          ,0x1b0);
          (*gl->uniform1i)(GVar5,0);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"uniform1i(samplerLoc, 0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                          ,0x1b1);
          (*gl->enableVertexAttribArray)(GVar4);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"enableVertexAttribArray(coordLoc)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                          ,0x1b2);
          (*gl->vertexAttribPointer)(GVar4,2,0x1406,'\0',0,squareTriangleCoords);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,
                          "vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                          ,0x1b3);
          (*gl->drawArrays)(4,0,6);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"drawArrays(GL_TRIANGLES, 0, 6)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                          ,0x1b5);
          (*gl->disableVertexAttribArray)(GVar4);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"disableVertexAttribArray(coordLoc)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                          ,0x1b6);
          (*gl->bindTexture)(0xde1,0);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"bindTexture(GL_TEXTURE_2D, 0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                          ,0x1b7);
          tcu::Surface::Surface(&refSurface,reference->m_width,reference->m_height);
          tcu::Surface::Surface(&screen,reference->m_width,reference->m_height);
          p_Var1 = gl->readPixels;
          tcu::Surface::getAccess(&local_1d8,&screen);
          (*p_Var1)(0,0,screen.m_width,screen.m_height,0x1908,0x1401,
                    local_1d8.super_ConstPixelBufferAccess.m_data);
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,
                          "readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                          ,0x1bb);
          tcu::Surface::getAccess(&local_1d8,&refSurface);
          tcu::copy((EVP_PKEY_CTX *)&local_1d8,
                    (EVP_PKEY_CTX *)
                    (reference->super_TextureLevelPyramid).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start);
          bVar2 = tcu::fuzzyCompare(log,"ComparisonResult","Image comparison result",&refSurface,
                                    &screen,0.05,COMPARE_LOG_RESULT);
          tcu::Surface::~Surface(&screen);
          tcu::Surface::~Surface(&refSurface);
          glu::ShaderProgram::~ShaderProgram(&program.super_ShaderProgram);
          glu::ObjectWrapper::~ObjectWrapper(&srcTex.super_ObjectWrapper);
          return bVar2;
        }
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Couldn\'t find uniform u_sampler","(int)samplerLoc != (int)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                   ,0x1ae);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Couldn\'t find attribute a_coord","(int)coordLoc != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                 ,0x1ab);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,(char *)0x0,"**img != EGL_NO_IMAGE_KHR",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
               ,0x18a);
    pcVar7 = tcu::Exception::~Exception;
    ppuVar8 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(pTVar6,ppuVar8,pcVar7);
}

Assistant:

bool GLES2ImageApi::RenderTexture2D::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;
	tcu::TestLog&			log		= api.getLog();
	Texture					srcTex	(gl);

	// Branch only taken in TryAll case
	if (reference.getFormat().order == tcu::TextureFormat::DS || reference.getFormat().order == tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, GLES2 does not support sampling depth textures
	if (reference.getFormat().order == tcu::TextureFormat::S)
		throw IllegalRendererException(); // Skip, GLES2 does not support sampling stencil textures

	gl.clearColor(0.0, 0.0, 0.0, 0.0);
	gl.viewport(0, 0, reference.getWidth(), reference.getHeight());
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);
	gl.disable(GL_DEPTH_TEST);

	log << tcu::TestLog::Message << "Rendering EGLImage as GL_TEXTURE_2D in context: " << api.m_contextId << tcu::TestLog::EndMessage;
	TCU_CHECK(**img != EGL_NO_IMAGE_KHR);

	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, *srcTex));
	imageTargetTexture2D(api.m_egl, gl, **img);

	GLU_CHECK_GLW_CALL(gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST));
	GLU_CHECK_GLW_CALL(gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST));
	GLU_CHECK_GLW_CALL(gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE));
	GLU_CHECK_GLW_CALL(gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE));

	const char* const vertexShader =
		"attribute highp vec2 a_coord;\n"
		"varying mediump vec2 v_texCoord;\n"
		"void main(void) {\n"
		"\tv_texCoord = vec2((a_coord.x + 1.0) * 0.5, (a_coord.y + 1.0) * 0.5);\n"
		"\tgl_Position = vec4(a_coord, -0.1, 1.0);\n"
		"}\n";

	const char* const fragmentShader =
		"varying mediump vec2 v_texCoord;\n"
		"uniform sampler2D u_sampler;\n"
		"void main(void) {\n"
		"\tmediump vec4 texColor = texture2D(u_sampler, v_texCoord);\n"
		"\tgl_FragColor = vec4(texColor);\n"
		"}";

	Program program(gl, vertexShader, fragmentShader);
	TCU_CHECK(program.isOk());

	GLuint glProgram = program.getProgram();
	GLU_CHECK_GLW_CALL(gl, useProgram(glProgram));

	GLuint coordLoc = gl.getAttribLocation(glProgram, "a_coord");
	TCU_CHECK_MSG((int)coordLoc != -1, "Couldn't find attribute a_coord");

	GLuint samplerLoc = gl.getUniformLocation(glProgram, "u_sampler");
	TCU_CHECK_MSG((int)samplerLoc != (int)-1, "Couldn't find uniform u_sampler");

	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, *srcTex));
	GLU_CHECK_GLW_CALL(gl, uniform1i(samplerLoc, 0));
	GLU_CHECK_GLW_CALL(gl, enableVertexAttribArray(coordLoc));
	GLU_CHECK_GLW_CALL(gl, vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords));

	GLU_CHECK_GLW_CALL(gl, drawArrays(GL_TRIANGLES, 0, 6));
	GLU_CHECK_GLW_CALL(gl, disableVertexAttribArray(coordLoc));
	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, 0));

	tcu::Surface refSurface	(reference.getWidth(), reference.getHeight());
	tcu::Surface screen		(reference.getWidth(), reference.getHeight());
	GLU_CHECK_GLW_CALL(gl, readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr()));

	tcu::copy(refSurface.getAccess(), reference.getLevel(0));

	float	threshold	= 0.05f;
	bool	match		= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refSurface, screen, threshold, tcu::COMPARE_LOG_RESULT);

	return match;
}